

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall choc::value::Value::Value(Value *this,Type *t,void *source,size_t size)

{
  Content *pCVar1;
  MainType MVar2;
  pointer puVar3;
  ComplexArray *other;
  Object *other_00;
  undefined8 uVar4;
  Object *this_00;
  Content *pCVar5;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> *local_38;
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,(uchar *)source,
             (uchar *)(size + (long)source),&local_39);
  (this->dictionary).super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__SimpleStringDictionary_00301210;
  local_38 = &(this->dictionary).strings;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  MVar2 = t->mainType;
  pCVar1 = &(this->value).type.content;
  pCVar5 = &t->content;
  (this->value).type.mainType = MVar2;
  (this->value).type.content.object = (Object *)0x0;
  (this->value).type.allocator = (Allocator *)0x0;
  if (MVar2 == object) {
    other_00 = pCVar5->object;
    this_00 = (Object *)malloc(0x28);
    Type::Object::Object(this_00,(Allocator *)0x0,other_00);
  }
  else {
    if (MVar2 != complexArray) {
      uVar4 = *(undefined8 *)((long)&t->content + 8);
      pCVar1->object = pCVar5->object;
      *(undefined8 *)((long)&(this->value).type.content + 8) = uVar4;
      goto LAB_001eb17e;
    }
    other = pCVar5->complexArray;
    this_00 = (Object *)malloc(0x18);
    Type::ComplexArray::ComplexArray((ComplexArray *)this_00,(Allocator *)0x0,other);
  }
  pCVar1->complexArray = (ComplexArray *)this_00;
LAB_001eb17e:
  (this->value).data = puVar3;
  (this->value).stringDictionary = &(this->dictionary).super_StringDictionary;
  return;
}

Assistant:

inline Value::Value (const Type& t, const void* source, size_t size)
   : packedData (static_cast<const uint8_t*> (source), static_cast<const uint8_t*> (source) + size),
     value (t, packedData.data(), std::addressof (dictionary))
{
}